

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

void hex_dump_c(char *addr,size_t len)

{
  long lVar1;
  char *pcVar2;
  
  if ((long)len < 1) {
    return;
  }
  pcVar2 = addr + 1;
  lVar1 = 0;
  do {
    if (lVar1 == 0) {
      putchar(0x22);
      lVar1 = 0xe;
    }
    printf("\\x%02x",(ulong)(byte)pcVar2[-1]);
    lVar1 = lVar1 + -1;
    if (lVar1 == 0) {
      puts("\"");
      if (addr + len <= pcVar2) {
        return;
      }
      lVar1 = 0;
    }
    else if (addr + len <= pcVar2) {
      puts("\"");
      return;
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

void
hex_dump_c (const char *addr, size_t len) {
	const char *addr_end = addr + len;
	size_t n = 0;
	while (addr < addr_end) {
		if (n == 0) { printf("\""); n = 14; }
		printf("\\x%02x", *(unsigned char *)addr);
		addr += 1; n -= 1;
		if (n == 0) { printf("\"\n"); }
	}
	if (n != 0) { printf("\"\n"); }
}